

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

shared_ptr<minja::TemplateNode> __thiscall
minja::Parser::parseTemplate
          (Parser *this,TemplateTokenIterator *begin,TemplateTokenIterator *it,
          TemplateTokenIterator *end,bool fully)

{
  Type TVar1;
  TemplateToken *pTVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *puVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  Parser *pPVar10;
  runtime_error *this_00;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *puVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  char cVar13;
  undefined7 in_register_00000081;
  long *plVar15;
  undefined4 in_R9D;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar16;
  bool bVar17;
  shared_ptr<minja::TemplateNode> sVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __result;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  cascade;
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  children;
  undefined1 local_e8 [47];
  undefined1 local_b9;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined4 local_3c;
  _func_int **local_38;
  undefined1 *puVar14;
  
  local_3c._0_1_ = (char)in_R9D;
  plVar15 = (long *)CONCAT71(in_register_00000081,fully);
  local_68.
  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar8 = end->_M_current;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (puVar8 != (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                *plVar15) {
    local_38 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00291698;
    local_88._24_8_ = it;
    local_3c = in_R9D;
    do {
      puVar11 = puVar8 + 1;
      end->_M_current = puVar11;
      pTVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
               ._M_t.
               super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
               .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl;
      local_a8._24_8_ = puVar8;
      if (pTVar2 == (TemplateToken *)0x0) {
LAB_002041a0:
        pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
        unexpected(pPVar10,(TemplateToken *)begin);
        __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,&IfTemplateToken::typeinfo,0);
      uVar4 = local_88._24_8_;
      if (lVar7 == 0) {
        lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,&ForTemplateToken::typeinfo,0);
        uVar4 = local_88._24_8_;
        if (lVar7 != 0) {
          parseTemplate((Parser *)local_b8,begin,(TemplateTokenIterator *)local_88._24_8_,end,fully)
          ;
          local_e8._0_8_ = (element_type *)0x0;
          local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          puVar8 = end->_M_current;
          puVar11 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                    *plVar15;
          if (puVar8 == puVar11) {
LAB_002041dc:
            pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
            unterminated(pPVar10,(TemplateToken *)begin);
            __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (((puVar8->_M_t).
               super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
               ._M_t.
               super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
               .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type == Else) {
            end->_M_current = puVar8 + 1;
            parseTemplate((Parser *)(local_a8 + 0x20),begin,(TemplateTokenIterator *)uVar4,end,fully
                         );
            uVar5 = local_88._8_8_;
            local_e8._0_8_ = local_88._0_8_;
            uVar4 = local_e8._8_8_;
            local_88._0_8_ = (element_type *)0x0;
            local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e8._8_8_ = uVar5;
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
            }
            puVar8 = end->_M_current;
            puVar11 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                       *)*plVar15;
          }
          if ((puVar8 == puVar11) ||
             (end->_M_current = puVar8 + 1,
             ((puVar8->_M_t).
              super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
              ._M_t.
              super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
              .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type != EndFor))
          goto LAB_002041dc;
          local_88._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<minja::ForNode,std::allocator<minja::ForNode>,minja::Location&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>,bool&,std::shared_ptr<minja::TemplateNode>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                     (ForNode **)(local_a8 + 0x20),(allocator<minja::ForNode> *)&local_b9,
                     &((((__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                          *)local_a8._24_8_)->
                       super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                       )._M_t.
                       super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                       .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->location
                     ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(lVar7 + 0x30),(shared_ptr<minja::Expression> *)(lVar7 + 0x48),
                     (shared_ptr<minja::Expression> *)(lVar7 + 0x58),
                     (shared_ptr<minja::TemplateNode> *)local_b8,(bool *)(lVar7 + 0x68),
                     (shared_ptr<minja::TemplateNode> *)local_e8);
          std::
          vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
          ::emplace_back<std::shared_ptr<minja::ForNode>>
                    ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                      *)&local_68,(shared_ptr<minja::ForNode> *)(local_a8 + 0x20));
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
          goto LAB_002036ab;
        }
        lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,&GenerationTemplateToken::typeinfo,0)
        ;
        if (lVar7 == 0) {
          lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,&TextTemplateToken::typeinfo,0);
          if (lVar7 != 0) {
            if (*(unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> **)
                 local_88._24_8_ ==
                (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                local_a8._24_8_) {
              bVar16 = false;
            }
            else {
              bVar16 = *(int *)((long)(((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                         *)(local_a8._24_8_ + -8))->_M_t).
                                      super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                               + 0x2c) == 1;
            }
            if (puVar11 ==
                (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                *plVar15) {
              bVar17 = false;
            }
            else {
              bVar17 = *(int *)((long)(puVar11->_M_t).
                                      super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                               + 0x28) == 1;
            }
            local_b8._0_8_ = local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b8,*(long *)(lVar7 + 0x30),
                       *(long *)(lVar7 + 0x38) + *(long *)(lVar7 + 0x30));
            if (bVar17) {
              if ((parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                   ::trailing_space_regex_abi_cxx11_ == '\0') &&
                 (iVar6 = __cxa_guard_acquire(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                               ::trailing_space_regex_abi_cxx11_), iVar6 != 0)) {
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          (&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                            ::trailing_space_regex_abi_cxx11_,"\\s+$",0x10);
                __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                             ~basic_regex,
                             &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                              ::trailing_space_regex_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                     ::trailing_space_regex_abi_cxx11_);
              }
              local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_e8._16_8_ = local_e8._16_8_ & 0xffffffffffffff00;
              local_e8._0_8_ = (element_type *)(local_e8 + 0x10);
              std::
              __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )local_b8._0_8_,
                         (char *)(local_b8._0_8_ + (long)(_func_int ***)local_b8._8_8_),
                         &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                          ::trailing_space_regex_abi_cxx11_,"",0,0);
              std::__cxx11::string::operator=((string *)local_b8,(string *)local_e8);
              if ((element_type *)local_e8._0_8_ != (element_type *)(local_e8 + 0x10)) {
                operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
              }
            }
            else if ((*(char *)((long)&begin[5]._M_current + 1) == '\x01') &&
                    (p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_,
                    end->_M_current !=
                    (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                    *plVar15)) {
              for (; p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&p_Var9[-1]._M_weak_count + 3)) {
                cVar13 = ((char *)(local_b8._0_8_ + -1))[(long)p_Var9];
                if ((cVar13 != '\t') && (cVar13 != ' ')) {
                  if (cVar13 != '\n') goto LAB_00203b27;
                  goto LAB_00203b1d;
                }
              }
              if (end->_M_current + -1 ==
                  *(unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> **)
                   local_88._24_8_) {
                p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00203b1d:
                std::__cxx11::string::resize((ulong)local_b8,(char)p_Var9);
              }
            }
LAB_00203b27:
            if (bVar16) {
              if ((parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                   ::leading_space_regex_abi_cxx11_ == '\0') &&
                 (iVar6 = __cxa_guard_acquire(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                               ::leading_space_regex_abi_cxx11_), iVar6 != 0)) {
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          (&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                            ::leading_space_regex_abi_cxx11_,"^\\s+",0x10);
                __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                             ~basic_regex,
                             &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                              ::leading_space_regex_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                     ::leading_space_regex_abi_cxx11_);
              }
              local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_e8._16_8_ = local_e8._16_8_ & 0xffffffffffffff00;
              local_e8._0_8_ = (element_type *)(local_e8 + 0x10);
              std::
              __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )local_b8._0_8_,
                         (char *)(local_b8._0_8_ + (long)(_func_int ***)local_b8._8_8_),
                         &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                          ::leading_space_regex_abi_cxx11_,"",0,0);
              std::__cxx11::string::operator=((string *)local_b8,(string *)local_e8);
              if ((element_type *)local_e8._0_8_ != (element_type *)(local_e8 + 0x10)) {
                operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
              }
            }
            else if ((((*(char *)&begin[5]._M_current == '\x01') &&
                      (end->_M_current + -1 !=
                       *(unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         **)local_88._24_8_)) &&
                     ((pTVar2 = end->_M_current[-2]._M_t.
                                super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                                .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl,
                      pTVar2 == (TemplateToken *)0x0 ||
                      (lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                              &ExpressionTemplateToken::typeinfo,0), lVar7 == 0))))
                    && (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
                        (*(char *)local_b8._0_8_ == '\n')))) {
              std::__cxx11::string::erase((ulong)local_b8,0);
            }
            if ((((end->_M_current ==
                   (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                   *plVar15) && (*(char *)((long)&begin[5]._M_current + 2) == '\0')) &&
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
               (((char *)(local_b8._0_8_ + -1))[local_b8._8_8_] == '\n')) {
              puVar14 = (undefined1 *)
                        ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                (local_b8._8_8_ + -0x10))->_M_weak_count + 3);
              if (puVar14 == (undefined1 *)0x0) {
                cVar13 = '\0';
              }
              else {
                if (((char *)(local_b8._0_8_ + -2))[local_b8._8_8_] == '\r') {
                  puVar14 = (undefined1 *)
                            ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    (local_b8._8_8_ + -0x10))->_M_weak_count + 2);
                }
                cVar13 = (char)puVar14;
              }
              std::__cxx11::string::resize((ulong)local_b8,cVar13);
            }
            local_e8._0_8_ = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<minja::TextNode,std::allocator<minja::TextNode>,minja::Location&,std::__cxx11::string&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                       (TextNode **)local_e8,(allocator<minja::TextNode> *)(local_a8 + 0x20),
                       &((((__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                            *)local_a8._24_8_)->
                         super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         )._M_t.
                         super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                         .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                        location,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
            std::
            vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
            ::emplace_back<std::shared_ptr<minja::TextNode>>
                      ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                        *)&local_68,(shared_ptr<minja::TextNode> *)local_e8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
            }
            if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
              operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
            }
            goto LAB_00203738;
          }
          lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,&ExpressionTemplateToken::typeinfo,
                                 0);
          if (lVar7 == 0) {
            lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,&SetTemplateToken::typeinfo,0);
            if (lVar7 == 0) {
              lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,&MacroTemplateToken::typeinfo,0
                                    );
              if (lVar7 == 0) {
                lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                       &FilterTemplateToken::typeinfo,0);
                if (lVar7 == 0) {
                  lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                         &CommentTemplateToken::typeinfo,0);
                  if (lVar7 != 0) goto LAB_00203738;
                  lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                         &LoopControlTemplateToken::typeinfo,0);
                  if (lVar7 != 0) {
                    local_b8._0_8_ = (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<minja::LoopControlNode,std::allocator<minja::LoopControlNode>,minja::Location&,minja::LoopControlType&>
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                               (LoopControlNode **)local_b8,
                               (allocator<minja::LoopControlNode> *)local_e8,&pTVar2->location,
                               (LoopControlType *)(lVar7 + 0x30));
                    std::
                    vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                    ::emplace_back<std::shared_ptr<minja::LoopControlNode>>
                              ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                                *)&local_68,(shared_ptr<minja::LoopControlNode> *)local_b8);
                    goto LAB_00203729;
                  }
                  lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                         &EndForTemplateToken::typeinfo,0);
                  if ((((lVar7 == 0) &&
                       (lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                               &EndSetTemplateToken::typeinfo,0), lVar7 == 0)) &&
                      ((lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                               &EndMacroTemplateToken::typeinfo,0), lVar7 == 0 &&
                       ((lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                                &EndFilterTemplateToken::typeinfo,0), lVar7 == 0 &&
                        (lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                                &EndIfTemplateToken::typeinfo,0), lVar7 == 0))))))
                     && ((lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                                 &ElseTemplateToken::typeinfo,0), lVar7 == 0 &&
                         ((lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                                  &EndGenerationTemplateToken::typeinfo,0),
                          lVar7 == 0 &&
                          (lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,
                                                  &ElifTemplateToken::typeinfo,0), lVar7 == 0))))))
                  goto LAB_002041a0;
                  end->_M_current =
                       (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)local_a8._24_8_;
                  puVar8 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)local_a8._24_8_;
                  break;
                }
                parseTemplate((Parser *)local_b8,begin,(TemplateTokenIterator *)local_88._24_8_,end,
                              fully);
                puVar8 = end->_M_current;
                if ((puVar8 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)*plVar15) ||
                   (end->_M_current = puVar8 + 1,
                   ((puVar8->_M_t).
                    super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                    .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
                   EndFilter)) {
                  pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
                  unterminated(pPVar10,(TemplateToken *)begin);
                  __cxa_throw(pPVar10,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                std::
                make_shared<minja::FilterNode,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                          ((Location *)local_e8,
                           (shared_ptr<minja::Expression> *)
                           &((((__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                                *)local_a8._24_8_)->
                             super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             )._M_t.
                             super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                             .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                            location,(shared_ptr<minja::TemplateNode> *)(lVar7 + 0x30));
                std::
                vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                ::emplace_back<std::shared_ptr<minja::FilterNode>>
                          ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                            *)&local_68,(shared_ptr<minja::FilterNode> *)local_e8);
              }
              else {
                parseTemplate((Parser *)local_b8,begin,(TemplateTokenIterator *)local_88._24_8_,end,
                              fully);
                puVar8 = end->_M_current;
                if ((puVar8 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)*plVar15) ||
                   (end->_M_current = puVar8 + 1,
                   ((puVar8->_M_t).
                    super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                    .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
                   EndMacro)) {
                  pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
                  unterminated(pPVar10,(TemplateToken *)begin);
                  __cxa_throw(pPVar10,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_e8._0_8_ = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<minja::MacroNode,std::allocator<minja::MacroNode>,minja::Location&,std::shared_ptr<minja::VariableExpr>,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>,std::shared_ptr<minja::TemplateNode>>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                           (MacroNode **)local_e8,(allocator<minja::MacroNode> *)(local_a8 + 0x20),
                           &((((__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                                *)local_a8._24_8_)->
                             super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             )._M_t.
                             super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                             .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                            location,(shared_ptr<minja::VariableExpr> *)(lVar7 + 0x30),
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                            *)(lVar7 + 0x40),(shared_ptr<minja::TemplateNode> *)local_b8);
                std::
                vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                ::emplace_back<std::shared_ptr<minja::MacroNode>>
                          ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                            *)&local_68,(shared_ptr<minja::MacroNode> *)local_e8);
              }
            }
            else {
              if (*(long *)(lVar7 + 0x68) != 0) {
                local_b8._0_8_ = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<minja::SetNode,std::allocator<minja::SetNode>,minja::Location&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::shared_ptr<minja::Expression>>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                           (SetNode **)local_b8,(allocator<minja::SetNode> *)local_e8,
                           &pTVar2->location,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (lVar7 + 0x30),
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(lVar7 + 0x50),(shared_ptr<minja::Expression> *)(lVar7 + 0x68));
                std::
                vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                ::emplace_back<std::shared_ptr<minja::SetNode>>
                          ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                            *)&local_68,(shared_ptr<minja::SetNode> *)local_b8);
                goto LAB_00203729;
              }
              parseTemplate((Parser *)local_b8,begin,(TemplateTokenIterator *)local_88._24_8_,end,
                            fully);
              puVar8 = end->_M_current;
              if ((puVar8 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)*plVar15) ||
                 (end->_M_current = puVar8 + 1,
                 ((puVar8->_M_t).
                  super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                  .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
                 EndSet)) {
                pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
                unterminated(pPVar10,(TemplateToken *)begin);
                __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              if (*(long *)(lVar7 + 0x38) != 0) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (this_00,"Namespaced set not supported in set with template value");
LAB_00204351:
                __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              if (*(long *)(lVar7 + 0x58) -
                  (long)*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         (lVar7 + 0x50) != 0x20) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (this_00,"Structural assignment not supported in set with template value")
                ;
                goto LAB_00204351;
              }
              local_e8._0_8_ = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<minja::SetTemplateNode,std::allocator<minja::SetTemplateNode>,minja::Location&,std::__cxx11::string&,std::shared_ptr<minja::TemplateNode>>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                         (SetTemplateNode **)local_e8,
                         (allocator<minja::SetTemplateNode> *)(local_a8 + 0x20),
                         &((((__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                              *)local_a8._24_8_)->
                           super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                           )._M_t.
                           super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                           .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                          location,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar7 + 0x50),(shared_ptr<minja::TemplateNode> *)local_b8);
              std::
              vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
              ::emplace_back<std::shared_ptr<minja::SetTemplateNode>>
                        ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                          *)&local_68,(shared_ptr<minja::SetTemplateNode> *)local_e8);
            }
LAB_002036ab:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
            }
          }
          else {
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
            p_Var9->_M_use_count = 1;
            p_Var9->_M_weak_count = 1;
            p_Var9->_vptr__Sp_counted_base = local_38;
            ExpressionNode::ExpressionNode
                      ((ExpressionNode *)(p_Var9 + 1),&pTVar2->location,
                       (shared_ptr<minja::Expression> *)(lVar7 + 0x30));
            local_b8._0_8_ = (element_type *)(p_Var9 + 1);
            local_b8._8_8_ = p_Var9;
            std::
            vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
            ::emplace_back<std::shared_ptr<minja::ExpressionNode>>
                      ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                        *)&local_68,(shared_ptr<minja::ExpressionNode> *)local_b8);
          }
        }
        else {
          parseTemplate((Parser *)local_b8,begin,(TemplateTokenIterator *)local_88._24_8_,end,fully)
          ;
          puVar8 = end->_M_current;
          if ((puVar8 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)*plVar15) ||
             (end->_M_current = puVar8 + 1,
             ((puVar8->_M_t).
              super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
              ._M_t.
              super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
              .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
             EndGeneration)) {
            pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
            unterminated(pPVar10,(TemplateToken *)begin);
            __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
          ::emplace_back<std::shared_ptr<minja::TemplateNode>>
                    ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                      *)&local_68,(shared_ptr<minja::TemplateNode> *)local_b8);
        }
LAB_00203729:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
      }
      else {
        local_b8._0_8_ = (element_type *)0x0;
        local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a8._0_8_ = (char *)0x0;
        parseTemplate((Parser *)local_e8,begin,(TemplateTokenIterator *)local_88._24_8_,end,fully);
        std::
        vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
        ::emplace_back<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                  ((vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
                    *)local_b8,(shared_ptr<minja::Expression> *)(lVar7 + 0x30),
                   (shared_ptr<minja::TemplateNode> *)local_e8);
        while( true ) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
          }
          puVar8 = end->_M_current;
          puVar11 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                    *plVar15;
          if (puVar8 == puVar11) goto LAB_00203ecd;
          TVar1 = ((puVar8->_M_t).
                   super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                   .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type;
          if (TVar1 != Elif) break;
          end->_M_current = puVar8 + 1;
          pTVar2 = (puVar8->_M_t).
                   super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                   .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl;
          if (pTVar2 == (TemplateToken *)0x0) {
            lVar7 = 0;
          }
          else {
            lVar7 = __dynamic_cast(pTVar2,&TemplateToken::typeinfo,&ElifTemplateToken::typeinfo,0);
          }
          parseTemplate((Parser *)local_e8,begin,(TemplateTokenIterator *)uVar4,end,fully);
          std::
          vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
          ::emplace_back<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                    ((vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
                      *)local_b8,(shared_ptr<minja::Expression> *)(lVar7 + 0x30),
                     (shared_ptr<minja::TemplateNode> *)local_e8);
        }
        if (TVar1 == Else) {
          local_88._0_8_ = (element_type *)0x0;
          end->_M_current = puVar8 + 1;
          parseTemplate((Parser *)local_e8,begin,(TemplateTokenIterator *)uVar4,end,fully);
          std::
          vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
          ::emplace_back<decltype(nullptr),std::shared_ptr<minja::TemplateNode>>
                    ((vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
                      *)local_b8,(void **)(local_a8 + 0x20),
                     (shared_ptr<minja::TemplateNode> *)local_e8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
          }
          puVar8 = end->_M_current;
          puVar11 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                    *plVar15;
        }
        if ((puVar8 == puVar11) ||
           (end->_M_current = puVar8 + 1,
           ((puVar8->_M_t).
            super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>.
            _M_t.
            super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
            .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type != EndIf)) {
LAB_00203ecd:
          pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
          unterminated(pPVar10,(TemplateToken *)begin);
          __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_e8._0_8_ = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<minja::IfNode,std::allocator<minja::IfNode>,minja::Location&,std::vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),(IfNode **)local_e8,
                   (allocator<minja::IfNode> *)(local_a8 + 0x20),
                   &((((__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                        *)local_a8._24_8_)->
                     super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                     )._M_t.
                     super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                     .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->location,
                   (vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                    *)local_b8);
        std::
        vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
        ::emplace_back<std::shared_ptr<minja::IfNode>>
                  ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                    *)&local_68,(shared_ptr<minja::IfNode> *)local_e8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
        }
        std::
        vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
        ::~vector((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                   *)local_b8);
      }
LAB_00203738:
      puVar8 = end->_M_current;
    } while (puVar8 != (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)*plVar15);
  }
  _Var12._M_pi = local_48._M_pi;
  if (((char)local_3c != '\0') &&
     (puVar8 != (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                *plVar15)) {
    pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
    unexpected(pPVar10,(TemplateToken *)begin);
    __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_68.
      super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_68.
      super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_e8._0_8_ = begin->_M_current;
    local_e8._8_8_ = begin[1]._M_current;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count + 1;
      }
    }
    local_e8._16_8_ = (char *)0x0;
    local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
    local_88._0_8_ = (element_type *)0x0;
    local_b8._0_8_ = (element_type *)local_a8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<minja::TextNode,std::allocator<minja::TextNode>,minja::Location,std::__cxx11::string>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
               (TextNode **)(local_a8 + 0x20),(allocator<minja::TextNode> *)&local_b9,
               (Location *)local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    uVar4 = local_88._8_8_;
    local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)&(_Var12._M_pi)->_vptr__Sp_counted_base)->
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = (element_type *)local_88._0_8_;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Var12._M_pi)->_M_use_count)->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    local_88._0_8_ = (element_type *)0x0;
    if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
  }
  else {
    peVar3 = (element_type *)
             ((_Alloc_hider *)
             &(local_68.
               super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)->_M_p;
    if ((long)local_68.
              super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_68.
              super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10) {
      (((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&(local_48._M_pi)->_vptr__Sp_counted_base)->
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar3;
      p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)local_68.
                       super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 8);
      *(size_type *)
       ((long)local_68.
              super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 8) = 0;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_48._M_pi)->_M_use_count)->_M_pi =
           p_Var9;
      ((_Alloc_hider *)
      &(local_68.
        super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)->_M_p = (pointer)0x0;
    }
    else {
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
      p_Var9->_M_use_count = 1;
      p_Var9->_M_weak_count = 1;
      p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00291a08;
      SequenceNode::SequenceNode
                ((SequenceNode *)(p_Var9 + 1),(Location *)&peVar3->_M_string_length,&local_68);
      (((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&(local_48._M_pi)->_vptr__Sp_counted_base)->
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)(p_Var9 + 1);
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_48._M_pi)->_M_use_count)->_M_pi =
           p_Var9;
      _Var12._M_pi = local_48._M_pi;
    }
  }
  std::
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ::~vector(&local_68);
  sVar18.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar18.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var12._M_pi;
  return (shared_ptr<minja::TemplateNode>)
         sVar18.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TemplateNode> parseTemplate(
          const TemplateTokenIterator & begin,
          TemplateTokenIterator & it,
          const TemplateTokenIterator & end,
          bool fully = false) const {
        std::vector<std::shared_ptr<TemplateNode>> children;
        while (it != end) {
          const auto start = it;
          const auto & token = *(it++);
          if (auto if_token = dynamic_cast<IfTemplateToken*>(token.get())) {
              std::vector<std::pair<std::shared_ptr<Expression>, std::shared_ptr<TemplateNode>>> cascade;
              cascade.emplace_back(std::move(if_token->condition), parseTemplate(begin, it, end));

              while (it != end && (*it)->type == TemplateToken::Type::Elif) {
                  auto elif_token = dynamic_cast<ElifTemplateToken*>((*(it++)).get());
                  cascade.emplace_back(std::move(elif_token->condition), parseTemplate(begin, it, end));
              }

              if (it != end && (*it)->type == TemplateToken::Type::Else) {
                cascade.emplace_back(nullptr, parseTemplate(begin, ++it, end));
              }
              if (it == end || (*(it++))->type != TemplateToken::Type::EndIf) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<IfNode>(token->location, std::move(cascade)));
          } else if (auto for_token = dynamic_cast<ForTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              auto else_body = std::shared_ptr<TemplateNode>();
              if (it != end && (*it)->type == TemplateToken::Type::Else) {
                else_body = parseTemplate(begin, ++it, end);
              }
              if (it == end || (*(it++))->type != TemplateToken::Type::EndFor) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<ForNode>(token->location, std::move(for_token->var_names), std::move(for_token->iterable), std::move(for_token->condition), std::move(body), for_token->recursive, std::move(else_body)));
          } else if (dynamic_cast<GenerationTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndGeneration) {
                  throw unterminated(**start);
              }
              // Treat as a no-op, as our scope is templates for inference, not training (`{% generation %}` wraps generated tokens for masking).
              children.emplace_back(std::move(body));
          } else if (auto text_token = dynamic_cast<TextTemplateToken*>(token.get())) {
              SpaceHandling pre_space = (it - 1) != begin ? (*(it - 2))->post_space : SpaceHandling::Keep;
              SpaceHandling post_space = it != end ? (*it)->pre_space : SpaceHandling::Keep;

              auto text = text_token->text;
              if (post_space == SpaceHandling::Strip) {
                static std::regex trailing_space_regex(R"(\s+$)");
                text = std::regex_replace(text, trailing_space_regex, "");
              } else if (options.lstrip_blocks && it != end) {
                auto i = text.size();
                while (i > 0 && (text[i - 1] == ' ' || text[i - 1] == '\t')) i--;
                if ((i == 0 && (it - 1) == begin) || (i > 0 && text[i - 1] == '\n')) {
                  text.resize(i);
                }
              }
              if (pre_space == SpaceHandling::Strip) {
                static std::regex leading_space_regex(R"(^\s+)");
                text = std::regex_replace(text, leading_space_regex, "");
              } else if (options.trim_blocks && (it - 1) != begin && !dynamic_cast<ExpressionTemplateToken*>((*(it - 2)).get())) {
                if (!text.empty() && text[0] == '\n') {
                  text.erase(0, 1);
                }
              }
              if (it == end && !options.keep_trailing_newline) {
                auto i = text.size();
                if (i > 0 && text[i - 1] == '\n') {
                  i--;
                  if (i > 0 && text[i - 1] == '\r') i--;
                  text.resize(i);
                }
              }
              children.emplace_back(std::make_shared<TextNode>(token->location, text));
          } else if (auto expr_token = dynamic_cast<ExpressionTemplateToken*>(token.get())) {
              children.emplace_back(std::make_shared<ExpressionNode>(token->location, std::move(expr_token->expr)));
          } else if (auto set_token = dynamic_cast<SetTemplateToken*>(token.get())) {
            if (set_token->value) {
              children.emplace_back(std::make_shared<SetNode>(token->location, set_token->ns, set_token->var_names, std::move(set_token->value)));
            } else {
              auto value_template = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndSet) {
                  throw unterminated(**start);
              }
              if (!set_token->ns.empty()) throw std::runtime_error("Namespaced set not supported in set with template value");
              if (set_token->var_names.size() != 1) throw std::runtime_error("Structural assignment not supported in set with template value");
              auto & name = set_token->var_names[0];
              children.emplace_back(std::make_shared<SetTemplateNode>(token->location, name, std::move(value_template)));
            }
          } else if (auto macro_token = dynamic_cast<MacroTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndMacro) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<MacroNode>(token->location, std::move(macro_token->name), std::move(macro_token->params), std::move(body)));
          } else if (auto filter_token = dynamic_cast<FilterTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndFilter) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<FilterNode>(token->location, std::move(filter_token->filter), std::move(body)));
          } else if (dynamic_cast<CommentTemplateToken*>(token.get())) {
              // Ignore comments
          } else if (auto ctrl_token = dynamic_cast<LoopControlTemplateToken*>(token.get())) {
              children.emplace_back(std::make_shared<LoopControlNode>(token->location, ctrl_token->control_type));
          } else if (dynamic_cast<EndForTemplateToken*>(token.get())
                  || dynamic_cast<EndSetTemplateToken*>(token.get())
                  || dynamic_cast<EndMacroTemplateToken*>(token.get())
                  || dynamic_cast<EndFilterTemplateToken*>(token.get())
                  || dynamic_cast<EndIfTemplateToken*>(token.get())
                  || dynamic_cast<ElseTemplateToken*>(token.get())
                  || dynamic_cast<EndGenerationTemplateToken*>(token.get())
                  || dynamic_cast<ElifTemplateToken*>(token.get())) {
              it--;  // unconsume the token
              break;  // exit the loop
          } else {
              throw unexpected(**(it-1));
          }
        }
        if (fully && it != end) {
            throw unexpected(**it);
        }
        if (children.empty()) {
          return std::make_shared<TextNode>(Location { template_str, 0 }, std::string());
        } else if (children.size() == 1) {
          return std::move(children[0]);
        } else {
          return std::make_shared<SequenceNode>(children[0]->location(), std::move(children));
        }
    }